

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

idx_t __thiscall duckdb::QuantileCursor<double>::Seek(QuantileCursor<double> *this,idx_t row_idx)

{
  bool bVar1;
  sel_t sVar2;
  double *pdVar3;
  ValidityMask *pVVar4;
  QuantileCursor<double> *in_RSI;
  QuantileCursor<double> *in_RDI;
  ColumnDataScanState *in_stack_00000018;
  idx_t in_stack_00000020;
  ColumnDataCollection *in_stack_00000028;
  
  bVar1 = RowIsVisible(in_RDI,(idx_t)in_RSI);
  if (!bVar1) {
    ColumnDataCollection::Seek
              (in_stack_00000028,in_stack_00000020,in_stack_00000018,(DataChunk *)this);
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)in_RSI,(size_type)in_RDI);
    pdVar3 = FlatVector::GetData<double>((Vector *)0x1d30020);
    in_RDI->data = pdVar3;
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)in_RSI,(size_type)in_RDI);
    pVVar4 = FlatVector::Validity((Vector *)0x1d30043);
    in_RDI->validity = pVVar4;
  }
  sVar2 = RowOffset(in_RSI,(idx_t)in_RDI);
  return (ulong)sVar2;
}

Assistant:

inline idx_t Seek(idx_t row_idx) {
		if (!RowIsVisible(row_idx)) {
			inputs.Seek(row_idx, scan, page);
			data = FlatVector::GetData<INPUT_TYPE>(page.data[0]);
			validity = &FlatVector::Validity(page.data[0]);
		}
		return RowOffset(row_idx);
	}